

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

int conn_is_conn(Curl_easy *data,connectdata *conn,void *param)

{
  bool bVar1;
  connfind *f;
  void *param_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  bVar1 = conn->connection_id == *param;
  if (bVar1) {
    *(connectdata **)((long)param + 8) = conn;
  }
  data_local._4_4_ = (uint)bVar1;
  return data_local._4_4_;
}

Assistant:

static int conn_is_conn(struct Curl_easy *data,
                        struct connectdata *conn, void *param)
{
  struct connfind *f = (struct connfind *)param;
  (void)data;
  if(conn->connection_id == f->id_tofind) {
    f->found = conn;
    return 1;
  }
  return 0;
}